

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObserver.cpp
# Opt level: O1

void __thiscall test_CEObserver::test_CEObserver(test_CEObserver *this)

{
  CEObserver *this_00;
  CEAngleType local_e4;
  double local_e0;
  double local_d8;
  double local_d0;
  CEObserver local_c8;
  
  CETestSuite::CETestSuite(&this->super_CETestSuite);
  *(undefined ***)this = &PTR__test_CEObserver_00143590;
  this_00 = &this->base_obs_;
  CEObserver::CEObserver(this_00);
  local_d0 = 0.0;
  local_d8 = 0.0;
  local_e0 = 0.0;
  local_e4 = DEGREES;
  CEObserver::CEObserver(&local_c8,&local_d0,&local_d8,&local_e0,&local_e4);
  CEObserver::operator=(this_00,&local_c8);
  CEObserver::~CEObserver(&local_c8);
  local_c8._vptr_CEObserver = (_func_int **)0x3ff0000000000000;
  CEObserver::SetWavelength_um(this_00,(double *)&local_c8);
  local_c8._vptr_CEObserver = (_func_int **)0x0;
  CEObserver::SetTemperature_C(this_00,(double *)&local_c8);
  local_c8._vptr_CEObserver = (_func_int **)0x0;
  CEObserver::SetPressure_hPa(this_00,(double *)&local_c8);
  return;
}

Assistant:

test_CEObserver::test_CEObserver() :
    CETestSuite()
{
    base_obs_ = CEObserver(0.0, 0.0, 0.0, CEAngleType::DEGREES);
    base_obs_.SetWavelength_um(1.0);
    base_obs_.SetTemperature_C(0.0);
    base_obs_.SetPressure_hPa(0.0);
}